

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

string * anon_unknown.dwarf_eb5c::cpputf8_u32_to_u8(string *__return_storage_ptr__,u32string *u32)

{
  size_type sVar1;
  pointer pcVar2;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  long lVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = u32->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (u32->_M_dataplus)._M_p;
    lVar3 = 0;
    result.container = __return_storage_ptr__;
    do {
      result = utf8::append<std::back_insert_iterator<std::__cxx11::string>>
                         (*(uint32_t *)((long)pcVar2 + lVar3),result);
      lVar3 = lVar3 + 4;
    } while (sVar1 << 2 != lVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

inline
string cpputf8_u32_to_u8(const u32string& u32)
{
    string u8;
    utf8::utf32to8(std::begin(u32), std::end(u32), std::back_inserter(u8));
    return u8;
}